

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resource.cpp
# Opt level: O1

void __thiscall CampResource_ConvertFails_Test::TestBody(CampResource_ConvertFails_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  TrueWithString gtest_msg;
  AssertionResult gtest_ar_;
  Resource h1;
  AssertHelper local_80;
  long *local_78;
  char *pcStack_70;
  long local_68 [4];
  Message local_48 [4];
  Resource local_28;
  
  camp::resources::v1::Resource::Resource<camp::resources::v1::Host,void>
            (&local_28,(Host *)&local_78);
  if ((local_28.m_value.
       super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr == (element_type *)0x0) ||
     ((local_28.m_value.
       super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ContextInterface != (_func_int **)&PTR__ContextInterface_00151bf8)) {
    camp::throw_re("Incompatible Resource type get cast.");
  }
  local_68[1] = 0;
  pcStack_70 = (char *)0x0;
  local_68[0] = 0;
  local_78 = local_68;
  bVar1 = testing::internal::AlwaysTrue();
  if ((bVar1) &&
     ((local_28.m_value.
       super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr == (element_type *)0x0 ||
      ((local_28.m_value.
        super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->_vptr_ContextInterface != (_func_int **)&PTR__ContextInterface_00151c98)))) {
    camp::throw_re("Incompatible Resource type get cast.");
  }
  std::__cxx11::string::_M_replace((ulong)&local_78,0,pcStack_70,0x13b14f);
  testing::Message::Message(local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/test/resource.cpp",0x1e,
             (char *)local_78);
  testing::internal::AssertHelper::operator=(&local_80,local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if (local_48[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_48[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_28.m_value.
      super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.m_value.
               super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(CampResource, ConvertFails)
{
  Resource h1{Host()};
  h1.get<Host>();
  ASSERT_THROW(h1.get<Host2>(), std::runtime_error);
  ASSERT_FALSE(h1.try_get<Host2>());
}